

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

void initialize_cpu_thread_affinity_mask(CpuSet *mask_all,CpuSet *mask_little,CpuSet *mask_big)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  CpuSet *in_RDX;
  CpuSet *in_RSI;
  CpuSet *in_RDI;
  int i_2;
  int max_freq_khz_medium;
  int max_freq_khz;
  int i_1;
  vector<int,_std::allocator<int>_> cpu_max_freq_khz;
  int max_freq_khz_max;
  int max_freq_khz_min;
  int i;
  int in_stack_000000a0;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffff98;
  int cpu;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_58;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  int local_24;
  int local_20;
  int local_1c;
  CpuSet *local_18;
  CpuSet *local_10;
  CpuSet *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ncnn::CpuSet::disable_all((CpuSet *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  for (local_1c = 0; local_1c < g_cpucount; local_1c = local_1c + 1) {
    ncnn::CpuSet::enable(local_8,local_1c);
  }
  local_20 = 0x7fffffff;
  local_24 = 0;
  __a = &local_41;
  std::allocator<int>::allocator((allocator<int> *)0x176763);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),__a);
  std::allocator<int>::~allocator((allocator<int> *)0x176783);
  for (local_58 = 0; local_58 < g_cpucount; local_58 = local_58 + 1) {
    in_stack_ffffffffffffff80 = get_max_freq_khz(in_stack_000000a0);
    in_stack_ffffffffffffff84 = in_stack_ffffffffffffff80;
    iVar2 = in_stack_ffffffffffffff80;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_58);
    *pvVar3 = in_stack_ffffffffffffff80;
    if (local_24 < iVar2) {
      local_24 = iVar2;
    }
    if (iVar2 < local_20) {
      local_20 = iVar2;
    }
  }
  iVar2 = (local_20 + local_24) / 2;
  if (iVar2 == local_24) {
    ncnn::CpuSet::disable_all
              ((CpuSet *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    memcpy(local_18,local_8,0x80);
  }
  else {
    for (cpu = 0; cpu < g_cpucount; cpu = cpu + 1) {
      bVar1 = is_smt_cpu((int)mask_all);
      if (bVar1) {
        ncnn::CpuSet::enable(local_18,cpu);
      }
      else {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)cpu);
        if (*pvVar3 < iVar2) {
          ncnn::CpuSet::enable(local_10,cpu);
        }
        else {
          ncnn::CpuSet::enable(local_18,cpu);
        }
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  return;
}

Assistant:

static void initialize_cpu_thread_affinity_mask(ncnn::CpuSet& mask_all, ncnn::CpuSet& mask_little, ncnn::CpuSet& mask_big)
{
    mask_all.disable_all();
    for (int i = 0; i < g_cpucount; i++)
    {
        mask_all.enable(i);
    }

#if defined _WIN32
// Check SDK >= Win7
#if _WIN32_WINNT >= _WIN32_WINNT_WIN7 // win7

    // Load GetLogicalProcessorInformationEx
    HMODULE kernel32 = LoadLibrary(TEXT("kernel32.dll"));
    if (!kernel32)
    {
        NCNN_LOGE("LoadLibrary kernel32.dll failed");
        return;
    }

    typedef BOOL(WINAPI * LPFN_GLPIE)(LOGICAL_PROCESSOR_RELATIONSHIP, PSYSTEM_LOGICAL_PROCESSOR_INFORMATION_EX, PDWORD);
    LPFN_GLPIE glpie = (LPFN_GLPIE)GetProcAddress(kernel32, "GetLogicalProcessorInformationEx");

    if (glpie != NULL)
    {
        DWORD bufferSize = 0;
        glpie(RelationProcessorCore, nullptr, &bufferSize);
        std::vector<BYTE> buffer(bufferSize);
        if (!GetLogicalProcessorInformationEx(RelationProcessorCore,
                                              (SYSTEM_LOGICAL_PROCESSOR_INFORMATION_EX*)(buffer.data()), &bufferSize))
        {
            NCNN_LOGE("GetLogicalProcessorInformationEx failed");
            return;
        }

        // A map from processor number to whether it is an E core
        std::vector<std::pair<DWORD, bool> > processorCoreType;
        BYTE maxEfficiencyClass = 0; // In a system without E cores, all cores EfficiencyClass is 0

        BYTE* ptr = buffer.data();
        while (ptr < buffer.data() + bufferSize)
        {
            SYSTEM_LOGICAL_PROCESSOR_INFORMATION_EX* info = (SYSTEM_LOGICAL_PROCESSOR_INFORMATION_EX*)ptr;
            if (info->Relationship == RelationProcessorCore)
            {
                // Mingw and some old MSVC do not have EfficiencyClass in PROCESSOR_RELATIONSHIP
                // So we should redefine PROCESSOR_RELATIONSHIP
                // Because ncnn need to support c++98, so we can't use some new features in c++11
                // So there is a ugly implementation

                BYTE efficiencyClass = ((BYTE*)&info->Processor)[1];

                bool isECore = (efficiencyClass == 0);
                maxEfficiencyClass = (std::max)(maxEfficiencyClass, efficiencyClass);

                for (WORD g = 0; g < info->Processor.GroupCount; ++g)
                {
                    const GROUP_AFFINITY& ga = info->Processor.GroupMask[g];
                    KAFFINITY mask = ga.Mask;
                    WORD group = ga.Group;
                    for (int bit = 0; bit < 64; ++bit)
                    {   // for each bit in the mask
                        if (mask & (static_cast<KAFFINITY>(1) << bit))
                        {
                            DWORD processorNumber = group * 64 + bit;
                            processorCoreType.push_back(std::pair<DWORD, bool>(processorNumber, isECore));
                        }
                    }
                }
            }
            ptr += info->Size;
        }

        if (maxEfficiencyClass == 0)
        {
            // All cores are P cores
            mask_little.disable_all();
            mask_big = mask_all;
        }
        else
        {
            for (int i = 0; i < g_cpucount; i++)
            {
                bool isECore = false;
                for (int j = 0; j < processorCoreType.size(); j++)
                {
                    std::pair<DWORD, bool> p = processorCoreType[j];
                    if (p.first == i)
                    {
                        isECore = p.second;
                        break;
                    }
                }
                // fprintf(stderr, "processor %d is %s\n", i, isECore ? "E" : "P");

                if (isECore)
                {
                    mask_little.enable(i);
                }
                else
                {
                    mask_big.enable(i);
                }
            }
        }
    }
    else
#endif
    {
        // get max freq mhz for all cores
        int max_freq_mhz_min = INT_MAX;
        int max_freq_mhz_max = 0;
        std::vector<int> cpu_max_freq_mhz = get_max_freq_mhz();
        for (int i = 0; i < g_cpucount; i++)
        {
            int max_freq_mhz = cpu_max_freq_mhz[i];

            // NCNN_LOGE("%d max freq = %d khz", i, max_freq_mhz);

            if (max_freq_mhz > max_freq_mhz_max)
                max_freq_mhz_max = max_freq_mhz;
            if (max_freq_mhz < max_freq_mhz_min)
                max_freq_mhz_min = max_freq_mhz;
        }

        int max_freq_mhz_medium = (max_freq_mhz_min + max_freq_mhz_max) / 2;
        if (max_freq_mhz_medium == max_freq_mhz_max)
        {
            mask_little.disable_all();
            mask_big = mask_all;
            return;
        }

        ncnn::CpuSet smt_cpu_mask = get_smt_cpu_mask();

        for (int i = 0; i < g_cpucount; i++)
        {
            if (smt_cpu_mask.is_enabled(i))
            {
                // always treat smt core as big core
                mask_big.enable(i);
                continue;
            }

            if (cpu_max_freq_mhz[i] < max_freq_mhz_medium)
                mask_little.enable(i);
            else
                mask_big.enable(i);
        }
    }
#elif defined __ANDROID__ || defined __linux__
    int max_freq_khz_min = INT_MAX;
    int max_freq_khz_max = 0;
    std::vector<int> cpu_max_freq_khz(g_cpucount);
    for (int i = 0; i < g_cpucount; i++)
    {
        int max_freq_khz = get_max_freq_khz(i);

        // NCNN_LOGE("%d max freq = %d khz", i, max_freq_khz);

        cpu_max_freq_khz[i] = max_freq_khz;

        if (max_freq_khz > max_freq_khz_max)
            max_freq_khz_max = max_freq_khz;
        if (max_freq_khz < max_freq_khz_min)
            max_freq_khz_min = max_freq_khz;
    }

    int max_freq_khz_medium = (max_freq_khz_min + max_freq_khz_max) / 2;
    if (max_freq_khz_medium == max_freq_khz_max)
    {
        mask_little.disable_all();
        mask_big = mask_all;
        return;
    }

    for (int i = 0; i < g_cpucount; i++)
    {
        if (is_smt_cpu(i))
        {
            // always treat smt core as big core
            mask_big.enable(i);
            continue;
        }

        if (cpu_max_freq_khz[i] < max_freq_khz_medium)
            mask_little.enable(i);
        else
            mask_big.enable(i);
    }
#elif __APPLE__
    int nperflevels = get_hw_capability("hw.nperflevels");
    if (nperflevels == 1)
    {
        // smp models
        mask_little.disable_all();
        mask_big = mask_all;
    }
    else
    {
        // two or more clusters, level0 is the high-performance cluster
        int perflevel0_logicalcpu = get_hw_capability("hw.perflevel0.logicalcpu_max");
        for (int i = 0; i < perflevel0_logicalcpu; i++)
        {
            mask_big.enable(i);
        }
        for (int i = perflevel0_logicalcpu; i < g_cpucount; i++)
        {
            mask_little.enable(i);
        }
    }
#else
    // TODO implement me for other platforms
    mask_little.disable_all();
    mask_big = mask_all;
#endif
}